

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>::push_back
          (SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true> *this,AddressEntry *Elt)

{
  undefined4 uVar1;
  size_t sVar2;
  size_t sVar3;
  iterator pAVar4;
  AddressEntry *Elt_local;
  SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true> *this_local;
  
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar3 <= sVar2) {
    grow(this,0);
  }
  pAVar4 = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>::end
                     (&this->
                       super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>);
  pAVar4->LowAddress = Elt->LowAddress;
  pAVar4->HighAddress = Elt->HighAddress;
  uVar1 = *(undefined4 *)&Elt->field_0x14;
  pAVar4->CuIndex = Elt->CuIndex;
  *(undefined4 *)&pAVar4->field_0x14 = uVar1;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar2 + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }